

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenCopyCtorAssignOpDefs(CppGenerator *this,StructDef *struct_def)

{
  IDLOptionsCpp *opts;
  BaseType BVar1;
  pointer ppFVar2;
  FieldDef *pFVar3;
  bool bVar4;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  string *this_00;
  pointer ppFVar8;
  byte bVar9;
  FieldDef *pFVar10;
  CodeWriter *this_01;
  allocator<char> local_511;
  undefined1 local_510 [32];
  string local_4f0;
  string initializer_list;
  string local_4b0;
  CppGenerator *local_490;
  string swaps;
  string local_450;
  string local_430;
  string local_410;
  string vector_copies;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  CodeWriter cw;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((0 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) &&
     (bVar4 = NeedsCopyCtorAssignOp(this,struct_def), bVar4)) {
    opts = &this->opts_;
    initializer_list._M_dataplus._M_p = (pointer)&initializer_list.field_2;
    initializer_list._M_string_length = 0;
    vector_copies._M_dataplus._M_p = (pointer)&vector_copies.field_2;
    vector_copies._M_string_length = 0;
    initializer_list.field_2._M_local_buf[0] = '\0';
    vector_copies.field_2._M_local_buf[0] = '\0';
    swaps._M_dataplus._M_p = (pointer)&swaps.field_2;
    swaps._M_string_length = 0;
    swaps.field_2._M_local_buf[0] = '\0';
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_490 = this;
    for (ppFVar8 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar2;
        ppFVar8 = ppFVar8 + 1) {
      pFVar3 = *ppFVar8;
      if (pFVar3->deprecated == false) {
        pVVar7 = &pFVar3->value;
        BVar1 = (pVVar7->type).base_type;
        if (BVar1 != BASE_TYPE_UTYPE) {
          if ((BVar1 == BASE_TYPE_VECTOR) || (BVar1 == BASE_TYPE_VECTOR64)) {
            local_510._0_4_ = (pFVar3->value).type.element;
            local_510._24_2_ = (pFVar3->value).type.fixed_length;
            local_510._4_4_ = BASE_TYPE_NONE;
            local_510._8_8_ = (pFVar3->value).type.struct_def;
            local_510._16_8_ = (pFVar3->value).type.enum_def;
            if (local_510._0_4_ != BASE_TYPE_UTYPE) {
              pFVar3 = *ppFVar8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cw,"cpp_type",(allocator<char> *)&local_4f0);
              pVVar7 = SymbolTable<flatbuffers::Value>::Lookup
                                 (&(pFVar3->super_Definition).attributes,(string *)&cw);
              std::__cxx11::string::~string((string *)&cw);
              pFVar3 = *ppFVar8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cw,"cpp_ptr_type",(allocator<char> *)&local_4f0);
              pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                                 (&(pFVar3->super_Definition).attributes,(string *)&cw);
              std::__cxx11::string::~string((string *)&cw);
              if (pVVar7 == (Value *)0x0) {
                GenTypeNative_abi_cxx11_(&local_4f0,this,(Type *)local_510,true,*ppFVar8,true);
              }
              else {
                std::__cxx11::string::string((string *)&local_4f0,(string *)&pVVar7->constant);
              }
              bVar4 = IsVectorOfPointers(*ppFVar8);
              if (pVVar7 != (Value *)0x0 && !bVar4) {
                bVar4 = std::operator!=(&pVVar5->constant,"naked");
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_90,"  ",(allocator<char> *)&local_4b0);
              CodeWriter::CodeWriter(&cw,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4b0,"FIELD",&local_511);
              Name_abi_cxx11_(&local_330,this,*ppFVar8);
              CodeWriter::SetValue(&cw,&local_4b0,&local_330);
              std::__cxx11::string::~string((string *)&local_330);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4b0,"TYPE",(allocator<char> *)&local_330);
              CodeWriter::SetValue(&cw,&local_4b0,&local_4f0);
              std::__cxx11::string::~string((string *)&local_4b0);
              if (bVar4 == false) {
                if (initializer_list._M_string_length != 0) {
                  std::__cxx11::string::append((char *)&initializer_list);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f0,"{{FIELD}}(o.{{FIELD}})\\",
                           (allocator<char> *)&local_4b0);
                CodeWriter::operator+=(&cw,&local_f0);
                std::__cxx11::string::~string((string *)&local_f0);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::append((string *)&initializer_list);
              }
              else {
                cw.cur_ident_lvl_ = cw.cur_ident_lvl_ + 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b0,"{{FIELD}}.reserve(o.{{FIELD}}.size());",
                           (allocator<char> *)&local_4b0);
                CodeWriter::operator+=(&cw,&local_b0);
                std::__cxx11::string::~string((string *)&local_b0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_d0,
                           "for (const auto &{{FIELD}}_ : o.{{FIELD}}) { {{FIELD}}.emplace_back(({{FIELD}}_) ? new {{TYPE}}(*{{FIELD}}_) : nullptr); }"
                           ,(allocator<char> *)&local_4b0);
                CodeWriter::operator+=(&cw,&local_d0);
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::append((string *)&vector_copies);
              }
              std::__cxx11::string::~string((string *)&local_4b0);
              CodeWriter::~CodeWriter(&cw);
              this_00 = &local_4f0;
              goto LAB_0016ce26;
            }
          }
          else {
            if (BVar1 == BASE_TYPE_STRUCT) {
              pFVar10 = pFVar3;
              if (initializer_list._M_string_length != 0) {
                std::__cxx11::string::append((char *)&initializer_list);
                pFVar10 = *ppFVar8;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cw,"cpp_type",(allocator<char> *)local_510);
              pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                                 (&(pFVar10->super_Definition).attributes,(string *)&cw);
              std::__cxx11::string::~string((string *)&cw);
              pFVar10 = *ppFVar8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cw,"cpp_ptr_type",(allocator<char> *)local_510);
              pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                                 (&(pFVar10->super_Definition).attributes,(string *)&cw);
              std::__cxx11::string::~string((string *)&cw);
              if (pVVar5 == (Value *)0x0) {
                GenTypeNative_abi_cxx11_
                          ((string *)local_510,local_490,&pVVar7->type,false,*ppFVar8,true);
              }
              else {
                std::__cxx11::string::string((string *)local_510,(string *)&pVVar5->constant);
              }
              bVar9 = 1;
              if ((((pVVar7->type).base_type == BASE_TYPE_STRUCT) &&
                  (((pFVar3->value).type.struct_def)->fixed == true)) &&
                 (bVar9 = (*ppFVar8)->native_inline ^ 1, pVVar5 != (Value *)0x0 && bVar9 == 0)) {
                bVar9 = std::operator!=(&pVVar6->constant,"naked");
              }
              local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
              local_410._M_string_length = 0;
              local_410.field_2._M_local_buf[0] = '\0';
              CodeWriter::CodeWriter(&cw,&local_410);
              std::__cxx11::string::~string((string *)&local_410);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f0,"FIELD",(allocator<char> *)&local_330);
              this = local_490;
              Name_abi_cxx11_(&local_4b0,local_490,*ppFVar8);
              CodeWriter::SetValue(&cw,&local_4f0,&local_4b0);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::__cxx11::string::~string((string *)&local_4f0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f0,"TYPE",(allocator<char> *)&local_4b0);
              CodeWriter::SetValue(&cw,&local_4f0,(string *)local_510);
              std::__cxx11::string::~string((string *)&local_4f0);
              if (bVar9 == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_70,"{{FIELD}}(o.{{FIELD}})\\",
                           (allocator<char> *)&local_4f0);
                CodeWriter::operator+=(&cw,&local_70);
                std::__cxx11::string::~string((string *)&local_70);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::append((string *)&initializer_list);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,
                           "{{FIELD}}((o.{{FIELD}}) ? new {{TYPE}}(*o.{{FIELD}}) : nullptr)\\",
                           (allocator<char> *)&local_4f0);
                CodeWriter::operator+=(&cw,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::append((string *)&initializer_list);
              }
              std::__cxx11::string::~string((string *)&local_4f0);
              CodeWriter::~CodeWriter(&cw);
              this_00 = (string *)local_510;
LAB_0016ce26:
              std::__cxx11::string::~string((string *)this_00);
            }
            else {
              if (initializer_list._M_string_length != 0) {
                std::__cxx11::string::append((char *)&initializer_list);
              }
              local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
              local_430._M_string_length = 0;
              local_430.field_2._M_local_buf[0] = '\0';
              CodeWriter::CodeWriter(&cw,&local_430);
              std::__cxx11::string::~string((string *)&local_430);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_510,"FIELD",(allocator<char> *)&local_4b0);
              Name_abi_cxx11_(&local_4f0,this,*ppFVar8);
              CodeWriter::SetValue(&cw,(string *)local_510,&local_4f0);
              std::__cxx11::string::~string((string *)&local_4f0);
              std::__cxx11::string::~string((string *)local_510);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"{{FIELD}}(o.{{FIELD}})\\",
                         (allocator<char> *)local_510);
              CodeWriter::operator+=(&cw,&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::append((string *)&initializer_list);
              std::__cxx11::string::~string((string *)local_510);
              CodeWriter::~CodeWriter(&cw);
            }
            if (swaps._M_string_length != 0) {
              std::__cxx11::string::append((char *)&swaps);
            }
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            local_450._M_string_length = 0;
            local_450.field_2._M_local_buf[0] = '\0';
            CodeWriter::CodeWriter(&cw,&local_450);
            std::__cxx11::string::~string((string *)&local_450);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_510,"FIELD",(allocator<char> *)&local_4b0);
            Name_abi_cxx11_(&local_4f0,this,*ppFVar8);
            CodeWriter::SetValue(&cw,(string *)local_510,&local_4f0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::__cxx11::string::~string((string *)local_510);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"std::swap({{FIELD}}, o.{{FIELD}});\\",
                       (allocator<char> *)local_510);
            CodeWriter::operator+=(&cw,&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::append((string *)&swaps);
            std::__cxx11::string::~string((string *)local_510);
            CodeWriter::~CodeWriter(&cw);
          }
        }
      }
    }
    if (initializer_list._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cw,
                     "\n      : ",&initializer_list);
      std::__cxx11::string::operator=((string *)&initializer_list,(string *)&cw);
      std::__cxx11::string::~string((string *)&cw);
    }
    if (swaps._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cw,"  ",
                     &swaps);
      std::__cxx11::string::operator=((string *)&swaps,(string *)&cw);
      std::__cxx11::string::~string((string *)&cw);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cw,"NATIVE_NAME",(allocator<char> *)&local_4b0);
    EscapeKeyword(&local_4f0,this,(string *)struct_def);
    NativeName((string *)local_510,&local_4f0,struct_def,&opts->super_IDLOptions);
    this_01 = &this->code_;
    CodeWriter::SetValue(this_01,(string *)&cw,(string *)local_510);
    std::__cxx11::string::~string((string *)local_510);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&cw);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cw,"INIT_LIST",(allocator<char> *)local_510);
    CodeWriter::SetValue(this_01,(string *)&cw,&initializer_list);
    std::__cxx11::string::~string((string *)&cw);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cw,"VEC_COPY",(allocator<char> *)local_510);
    CodeWriter::SetValue(this_01,(string *)&cw,&vector_copies);
    std::__cxx11::string::~string((string *)&cw);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cw,"SWAPS",(allocator<char> *)local_510);
    CodeWriter::SetValue(this_01,(string *)&cw,&swaps);
    std::__cxx11::string::~string((string *)&cw);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,
               "inline {{NATIVE_NAME}}::{{NATIVE_NAME}}(const {{NATIVE_NAME}} &o){{INIT_LIST}} {",
               (allocator<char> *)&cw);
    CodeWriter::operator+=(this_01,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"{{VEC_COPY}}}\n",(allocator<char> *)&cw);
    CodeWriter::operator+=(this_01,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,
               "inline {{NATIVE_NAME}} &{{NATIVE_NAME}}::operator=({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT {"
               ,(allocator<char> *)&cw);
    CodeWriter::operator+=(this_01,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"{{SWAPS}}",(allocator<char> *)&cw);
    CodeWriter::operator+=(this_01,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"  return *this;\n}\n",(allocator<char> *)&cw);
    CodeWriter::operator+=(this_01,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&swaps);
    std::__cxx11::string::~string((string *)&vector_copies);
    std::__cxx11::string::~string((string *)&initializer_list);
  }
  return;
}

Assistant:

void GenCopyCtorAssignOpDefs(const StructDef &struct_def) {
    if (opts_.g_cpp_std < cpp::CPP_STD_11) return;
    if (!NeedsCopyCtorAssignOp(struct_def)) return;
    std::string initializer_list;
    std::string vector_copies;
    std::string swaps;
    for (const auto &field : struct_def.fields.vec) {
      const auto &type = field->value.type;
      if (field->deprecated || type.base_type == BASE_TYPE_UTYPE) continue;
      if (type.base_type == BASE_TYPE_STRUCT) {
        if (!initializer_list.empty()) { initializer_list += ",\n        "; }
        const auto cpp_type = field->attributes.Lookup("cpp_type");
        const auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
        const std::string &type_name =
            (cpp_type) ? cpp_type->constant
                       : GenTypeNative(type, /*invector*/ false, *field,
                                       /*forcopy*/ true);
        const bool is_ptr = !(IsStruct(type) && field->native_inline) ||
                            (cpp_type && cpp_ptr_type->constant != "naked");
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw.SetValue("TYPE", type_name);
        if (is_ptr) {
          cw +=
              "{{FIELD}}((o.{{FIELD}}) ? new {{TYPE}}(*o.{{FIELD}}) : "
              "nullptr)\\";
          initializer_list += cw.ToString();
        } else {
          cw += "{{FIELD}}(o.{{FIELD}})\\";
          initializer_list += cw.ToString();
        }
      } else if (IsVector(type)) {
        const auto vec_type = type.VectorType();
        if (vec_type.base_type == BASE_TYPE_UTYPE) continue;
        const auto cpp_type = field->attributes.Lookup("cpp_type");
        const auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
        const std::string &type_name =
            (cpp_type) ? cpp_type->constant
                       : GenTypeNative(vec_type, /*invector*/ true, *field,
                                       /*forcopy*/ true);
        const bool is_ptr = IsVectorOfPointers(*field) ||
                            (cpp_type && cpp_ptr_type->constant != "naked");
        CodeWriter cw("  ");
        cw.SetValue("FIELD", Name(*field));
        cw.SetValue("TYPE", type_name);
        if (is_ptr) {
          // Use emplace_back to construct the potentially-smart pointer element
          // from a raw pointer to a new-allocated copy.
          cw.IncrementIdentLevel();
          cw += "{{FIELD}}.reserve(o.{{FIELD}}.size());";
          cw +=
              "for (const auto &{{FIELD}}_ : o.{{FIELD}}) { "
              "{{FIELD}}.emplace_back(({{FIELD}}_) ? new {{TYPE}}(*{{FIELD}}_) "
              ": nullptr); }";
          vector_copies += cw.ToString();
        } else {
          // For non-pointer elements, use std::vector's copy constructor in the
          // initializer list. This will yield better performance than an insert
          // range loop for trivially-copyable element types.
          if (!initializer_list.empty()) { initializer_list += ",\n        "; }
          cw += "{{FIELD}}(o.{{FIELD}})\\";
          initializer_list += cw.ToString();
        }
      } else {
        if (!initializer_list.empty()) { initializer_list += ",\n        "; }
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw += "{{FIELD}}(o.{{FIELD}})\\";
        initializer_list += cw.ToString();
      }
      {
        if (!swaps.empty()) { swaps += "\n  "; }
        CodeWriter cw;
        cw.SetValue("FIELD", Name(*field));
        cw += "std::swap({{FIELD}}, o.{{FIELD}});\\";
        swaps += cw.ToString();
      }
    }
    if (!initializer_list.empty()) {
      initializer_list = "\n      : " + initializer_list;
    }
    if (!swaps.empty()) { swaps = "  " + swaps; }

    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));
    code_.SetValue("INIT_LIST", initializer_list);
    code_.SetValue("VEC_COPY", vector_copies);
    code_.SetValue("SWAPS", swaps);

    code_ +=
        "inline {{NATIVE_NAME}}::{{NATIVE_NAME}}(const {{NATIVE_NAME}} &o)"
        "{{INIT_LIST}} {";
    code_ += "{{VEC_COPY}}}\n";
    code_ +=
        "inline {{NATIVE_NAME}} &{{NATIVE_NAME}}::operator="
        "({{NATIVE_NAME}} o) FLATBUFFERS_NOEXCEPT {";
    code_ += "{{SWAPS}}";
    code_ += "  return *this;\n}\n";
  }